

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O2

CMReturn * __thiscall
ConfusableMatcher::IndexOf
          (CMReturn *__return_storage_ptr__,ConfusableMatcher *this,string *In,string *Contains,
          CMOptions Options)

{
  CMStringView In_00;
  CMStringView Contains_00;
  
  if (Contains->_M_string_length == 0) {
    __return_storage_ptr__->Start = 0;
    __return_storage_ptr__->Size = 0;
    __return_storage_ptr__->Status = MATCH;
  }
  else if (Options.StartIndex < In->_M_string_length) {
    In_00._M_str = (In->_M_dataplus)._M_p;
    In_00._M_len = In->_M_string_length;
    Contains_00._M_str = (Contains->_M_dataplus)._M_p;
    Contains_00._M_len = Contains->_M_string_length;
    IndexOfFromView<(CMDebugLevel)0>
              (__return_storage_ptr__,this,In_00,Contains_00,Options,
               (vector<_CMDebugFailure,_std::allocator<_CMDebugFailure>_> *)0x0);
  }
  else {
    __return_storage_ptr__->Status = NO_MATCH;
    __return_storage_ptr__->Start = 0;
    __return_storage_ptr__->Size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

CMReturn ConfusableMatcher::IndexOf(std::string In, std::string Contains, CMOptions Options)
{
	if (Contains.size() == 0) {
		CMReturn ret;

		ret.Status = MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	if (Options.StartIndex >= In.size() || Options.StartIndex < 0) {
		CMReturn ret;
		ret.Status = NO_MATCH;
		ret.Start = 0;
		ret.Size = 0;
		return ret;
	}

	return IndexOfFromView<DEBUG_LEVEL_NONE>(CMStringView(In), CMStringView(Contains), Options, nullptr);
}